

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filesystem.cc
# Opt level: O0

string * __thiscall
phosg::preadx_abi_cxx11_(string *__return_storage_ptr__,phosg *this,int fd,size_t size,off_t offset)

{
  int fd_00;
  char *data;
  undefined4 in_register_00000014;
  allocator<char> local_2a;
  undefined1 local_29;
  size_t local_28;
  off_t offset_local;
  size_t size_local;
  string *psStack_10;
  int fd_local;
  string *ret;
  
  size_local._4_4_ = (int)this;
  local_29 = 0;
  local_28 = size;
  offset_local = CONCAT44(in_register_00000014,fd);
  psStack_10 = __return_storage_ptr__;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,CONCAT44(in_register_00000014,fd),'\0',&local_2a);
  ::std::allocator<char>::~allocator(&local_2a);
  fd_00 = size_local._4_4_;
  data = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                   ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    __return_storage_ptr__);
  preadx(fd_00,data,offset_local,local_28);
  return __return_storage_ptr__;
}

Assistant:

string preadx(int fd, size_t size, off_t offset) {
  string ret(size, 0);
  preadx(fd, ret.data(), size, offset);
  return ret;
}